

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# requantize.cpp
# Opt level: O0

int __thiscall ncnn::Requantize::load_model(Requantize *this,ModelBin *mb)

{
  bool bVar1;
  long *in_RSI;
  Mat *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  Mat *in_stack_ffffffffffffff98;
  undefined1 local_58 [88];
  
  if (*(int *)&in_RDI[2].refcount != 0) {
    (**(code **)(*in_RSI + 0x10))
              (local_58,in_RSI,*(undefined4 *)((long)&in_RDI[2].refcount + 4),1,in_R8,in_R9,local_58
              );
    Mat::operator=(in_stack_ffffffffffffff98,in_RDI);
    Mat::~Mat((Mat *)0x1b839d);
    bVar1 = Mat::empty(in_RDI);
    if (bVar1) {
      return -100;
    }
  }
  return 0;
}

Assistant:

int Requantize::load_model(const ModelBin& mb)
{
    if (bias_term)
    {
        bias_data = mb.load(bias_data_size, 1);
        if (bias_data.empty())
            return -100;
    }

    return 0;
}